

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,ParentNameQuery *b)

{
  bool bVar1;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_48;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_28;
  
  Symbol::parent_name_key(&local_28,(Symbol *)this);
  local_48.second._M_str = (char *)a[2].ptr_;
  local_48.first = a->ptr_;
  local_48.second._M_len = (size_t)a[1].ptr_;
  bVar1 = std::operator==(&local_28,&local_48);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }